

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_flac_init(ma_read_proc onRead,ma_seek_proc onSeek,ma_tell_proc onTell,
                      void *pReadSeekTellUserData,ma_decoding_backend_config *pConfig,
                      ma_allocation_callbacks *pAllocationCallbacks,ma_flac *pFlac)

{
  ma_format mVar1;
  ma_result mVar2;
  ma_dr_flac *pmVar3;
  ma_data_source_base *pDataSourceBase;
  
  mVar2 = MA_INVALID_ARGS;
  if (pFlac != (ma_flac *)0x0) {
    pFlac->pReadSeekTellUserData = (void *)0x0;
    *(undefined8 *)&pFlac->format = 0;
    pFlac->onSeek = (ma_seek_proc)0x0;
    pFlac->onTell = (ma_tell_proc)0x0;
    *(undefined8 *)&(pFlac->ds).isLooping = 0;
    pFlac->onRead = (ma_read_proc)0x0;
    (pFlac->ds).pNext = (ma_data_source *)0x0;
    (pFlac->ds).onGetNext = (ma_data_source_get_next_proc)0x0;
    (pFlac->ds).loopEndInFrames = 0;
    (pFlac->ds).pCurrent = (ma_data_source *)0x0;
    (pFlac->ds).rangeEndInFrames = 0;
    (pFlac->ds).loopBegInFrames = 0;
    (pFlac->ds).vtable = (ma_data_source_vtable *)0x0;
    (pFlac->ds).rangeBegInFrames = 0;
    pFlac->dr = (ma_dr_flac *)0x0;
    pFlac->format = ma_format_f32;
    if (((pConfig != (ma_decoding_backend_config *)0x0) &&
        (mVar1 = pConfig->preferredFormat, mVar1 < ma_format_count)) &&
       ((0x34U >> (mVar1 & 0x1f) & 1) != 0)) {
      pFlac->format = mVar1;
    }
    (pFlac->ds).rangeBegInFrames = 0;
    (pFlac->ds).rangeEndInFrames = 0;
    (pFlac->ds).loopBegInFrames = 0;
    (pFlac->ds).loopEndInFrames = 0;
    (pFlac->ds).pCurrent = (ma_data_source *)0x0;
    (pFlac->ds).pNext = (ma_data_source *)0x0;
    (pFlac->ds).onGetNext = (ma_data_source_get_next_proc)0x0;
    *(undefined8 *)&(pFlac->ds).isLooping = 0;
    (pFlac->ds).vtable = &g_ma_flac_ds_vtable;
    (pFlac->ds).rangeEndInFrames = 0xffffffffffffffff;
    (pFlac->ds).loopEndInFrames = 0xffffffffffffffff;
    (pFlac->ds).pCurrent = pFlac;
    (pFlac->ds).pNext = (ma_data_source *)0x0;
    (pFlac->ds).onGetNext = (ma_data_source_get_next_proc)0x0;
    if (onSeek != (ma_seek_proc)0x0 && onRead != (ma_read_proc)0x0) {
      pFlac->onRead = onRead;
      pFlac->onSeek = onSeek;
      pFlac->onTell = onTell;
      pFlac->pReadSeekTellUserData = pReadSeekTellUserData;
      pmVar3 = ma_dr_flac_open_with_metadata_private
                         (ma_flac_dr_callback__read,ma_flac_dr_callback__seek,
                          (ma_dr_flac_meta_proc)0x0,ma_dr_flac_container_unknown,pFlac,pFlac,
                          pAllocationCallbacks);
      pFlac->dr = pmVar3;
      mVar2 = MA_INVALID_FILE;
      if (pmVar3 != (ma_dr_flac *)0x0) {
        mVar2 = MA_SUCCESS;
      }
    }
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_flac_init(ma_read_proc onRead, ma_seek_proc onSeek, ma_tell_proc onTell, void* pReadSeekTellUserData, const ma_decoding_backend_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_flac* pFlac)
{
    ma_result result;

    result = ma_flac_init_internal(pConfig, pFlac);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (onRead == NULL || onSeek == NULL) {
        return MA_INVALID_ARGS; /* onRead and onSeek are mandatory. */
    }

    pFlac->onRead = onRead;
    pFlac->onSeek = onSeek;
    pFlac->onTell = onTell;
    pFlac->pReadSeekTellUserData = pReadSeekTellUserData;

    #if !defined(MA_NO_FLAC)
    {
        pFlac->dr = ma_dr_flac_open(ma_flac_dr_callback__read, ma_flac_dr_callback__seek, pFlac, pAllocationCallbacks);
        if (pFlac->dr == NULL) {
            return MA_INVALID_FILE;
        }

        return MA_SUCCESS;
    }
    #else
    {
        /* flac is disabled. */
        (void)pAllocationCallbacks;
        return MA_NOT_IMPLEMENTED;
    }
    #endif
}